

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayStencilAttachments.cpp
# Opt level: O3

void __thiscall
glcts::TextureCubeMapArrayStencilAttachments::createImmutableCubeArrayColor
          (TextureCubeMapArrayStencilAttachments *this,GLuint test_index)

{
  CubeMapArrayDataStorage *pCVar1;
  int iVar2;
  deUint32 err;
  undefined4 extraout_var;
  
  iVar2 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  pCVar1 = this->m_cube_map_array_data;
  (**(code **)(CONCAT44(extraout_var,iVar2) + 0x1398))
            (0x9009,1,0x8058,pCVar1[test_index].m_width,pCVar1[test_index].m_height,
             pCVar1[test_index].m_depth);
  err = (**(code **)(CONCAT44(extraout_var,iVar2) + 0x800))();
  glu::checkError(err,"Could not create an immutable color texture storage!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayStencilAttachments.cpp"
                  ,0x201);
  return;
}

Assistant:

void TextureCubeMapArrayStencilAttachments::createImmutableCubeArrayColor(glw::GLuint test_index)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	gl.texStorage3D(GL_TEXTURE_CUBE_MAP_ARRAY,					   /* target */
					1,											   /* levels */
					GL_RGBA8,									   /* internalformat */
					m_cube_map_array_data[test_index].getWidth(),  /* width */
					m_cube_map_array_data[test_index].getHeight(), /* height */
					m_cube_map_array_data[test_index].getDepth()); /* depth */

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create an immutable color texture storage!");
}